

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_ClassifySupport
              (DdManager *dd,DdNode *f,DdNode *g,DdNode **common,DdNode **onlyF,DdNode **onlyG)

{
  int *support;
  int *support_00;
  DdNode *pDVar1;
  DdNode *pDVar2;
  int local_74;
  int local_70;
  int local_68;
  int size;
  int j;
  int i;
  DdNode *var;
  DdNode *tmp;
  int *supportG;
  int *supportF;
  DdNode **onlyG_local;
  DdNode **onlyF_local;
  DdNode **common_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_70 = dd->sizeZ;
  }
  else {
    local_70 = dd->size;
  }
  support = (int *)malloc((long)local_70 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local._4_4_ = 0;
  }
  else {
    support_00 = (int *)malloc((long)local_70 << 2);
    if (support_00 == (int *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      if (support != (int *)0x0) {
        free(support);
      }
      dd_local._4_4_ = 0;
    }
    else {
      for (size = 0; size < local_70; size = size + 1) {
        support[size] = 0;
        support_00[size] = 0;
      }
      ddSupportStep((DdNode *)((ulong)f & 0xfffffffffffffffe),support);
      ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
      ddSupportStep((DdNode *)((ulong)g & 0xfffffffffffffffe),support_00);
      ddClearFlag((DdNode *)((ulong)g & 0xfffffffffffffffe));
      pDVar1 = dd->one;
      *onlyG = pDVar1;
      *onlyF = pDVar1;
      *common = pDVar1;
      *(int *)(((ulong)*common & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)*common & 0xfffffffffffffffe) + 4) + 1;
      *(int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4) + 1;
      *(int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4) + 1;
      while (local_68 = local_70 + -1, -1 < local_68) {
        if (local_68 < dd->size) {
          local_74 = dd->invperm[local_68];
        }
        else {
          local_74 = local_68;
        }
        local_70 = local_68;
        if ((support[local_74] != 0) || (support_00[local_74] != 0)) {
          pDVar1 = cuddUniqueInter(dd,local_74,dd->one,(DdNode *)((ulong)dd->one ^ 1));
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          if (support_00[local_74] == 0) {
            pDVar2 = Cudd_bddAnd(dd,*onlyF,pDVar1);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,*common);
              Cudd_RecursiveDeref(dd,*onlyF);
              Cudd_RecursiveDeref(dd,*onlyG);
              Cudd_RecursiveDeref(dd,pDVar1);
              if (support != (int *)0x0) {
                free(support);
              }
              if (support_00 != (int *)0x0) {
                free(support_00);
              }
              return 0;
            }
            *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,*onlyF);
            *onlyF = pDVar2;
          }
          else if (support[local_74] == 0) {
            pDVar2 = Cudd_bddAnd(dd,*onlyG,pDVar1);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,*common);
              Cudd_RecursiveDeref(dd,*onlyF);
              Cudd_RecursiveDeref(dd,*onlyG);
              Cudd_RecursiveDeref(dd,pDVar1);
              if (support != (int *)0x0) {
                free(support);
              }
              if (support_00 != (int *)0x0) {
                free(support_00);
              }
              return 0;
            }
            *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,*onlyG);
            *onlyG = pDVar2;
          }
          else {
            pDVar2 = Cudd_bddAnd(dd,*common,pDVar1);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,*common);
              Cudd_RecursiveDeref(dd,*onlyF);
              Cudd_RecursiveDeref(dd,*onlyG);
              Cudd_RecursiveDeref(dd,pDVar1);
              if (support != (int *)0x0) {
                free(support);
              }
              if (support_00 != (int *)0x0) {
                free(support_00);
              }
              return 0;
            }
            *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,*common);
            *common = pDVar2;
          }
          Cudd_RecursiveDeref(dd,pDVar1);
        }
      }
      if (support != (int *)0x0) {
        free(support);
      }
      if (support_00 != (int *)0x0) {
        free(support_00);
      }
      *(int *)(((ulong)*common & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)*common & 0xfffffffffffffffe) + 4) + -1;
      *(int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)*onlyF & 0xfffffffffffffffe) + 4) + -1;
      *(int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)*onlyG & 0xfffffffffffffffe) + 4) + -1;
      dd_local._4_4_ = 1;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_ClassifySupport(
  DdManager * dd /* manager */,
  DdNode * f /* first DD */,
  DdNode * g /* second DD */,
  DdNode ** common /* cube of shared variables */,
  DdNode ** onlyF /* cube of variables only in f */,
  DdNode ** onlyG /* cube of variables only in g */)
{
    int *supportF, *supportG;
    DdNode *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support arrays for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    supportF = ABC_ALLOC(int,size);
    if (supportF == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    supportG = ABC_ALLOC(int,size);
    if (supportG == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(supportF);
        return(0);
    }
    for (i = 0; i < size; i++) {
        supportF[i] = 0;
        supportG[i] = 0;
    }

    /* Compute supports and clean up markers. */
    ddSupportStep(Cudd_Regular(f),supportF);
    ddClearFlag(Cudd_Regular(f));
    ddSupportStep(Cudd_Regular(g),supportG);
    ddClearFlag(Cudd_Regular(g));

    /* Classify variables and create cubes. */
    *common = *onlyF = *onlyG = DD_ONE(dd);
    cuddRef(*common); cuddRef(*onlyF); cuddRef(*onlyG);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (supportF[i] == 0 && supportG[i] == 0) continue;
        var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
        cuddRef(var);
        if (supportG[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyF,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyF);
            *onlyF = tmp;
        } else if (supportF[i] == 0) {
            tmp = Cudd_bddAnd(dd,*onlyG,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*onlyG);
            *onlyG = tmp;
        } else {
            tmp = Cudd_bddAnd(dd,*common,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,*common);
                Cudd_RecursiveDeref(dd,*onlyF);
                Cudd_RecursiveDeref(dd,*onlyG);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(supportF); ABC_FREE(supportG);
                return(0);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,*common);
            *common = tmp;
        }
        Cudd_RecursiveDeref(dd,var);
    }

    ABC_FREE(supportF); ABC_FREE(supportG);
    cuddDeref(*common); cuddDeref(*onlyF); cuddDeref(*onlyG);
    return(1);

}